

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day15a.cpp
# Opt level: O1

istream * day15a::operator>>(istream *is,Disc *disc)

{
  istream *piVar1;
  string d;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  
  local_28 = 0;
  local_20 = 0;
  local_30 = &local_20;
  piVar1 = std::operator>>(is,(string *)&local_30);
  piVar1 = std::operator>>(piVar1,(string *)&local_30);
  piVar1 = std::operator>>(piVar1,(string *)&local_30);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&disc->max);
  piVar1 = std::operator>>(piVar1,(string *)&local_30);
  piVar1 = std::operator>>(piVar1,(string *)&local_30);
  piVar1 = std::operator>>(piVar1,(string *)&local_30);
  piVar1 = std::operator>>(piVar1,(string *)&local_30);
  piVar1 = std::operator>>(piVar1,(string *)&local_30);
  piVar1 = std::operator>>(piVar1,(string *)&local_30);
  piVar1 = std::operator>>(piVar1,(string *)&local_30);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&disc->position);
  piVar1 = std::operator>>(piVar1,(string *)&local_30);
  if (local_30 != &local_20) {
    operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
  }
  return piVar1;
}

Assistant:

std::istream& operator >> (std::istream& is, Disc& disc) {
		std::string d;
		return is >> d >> d >> d >> disc.max >> d >> d >> d >> d >> d >> d >> d >> disc.position >> d;
	}